

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

void Curl_pgrsSetUploadSize(Curl_easy *data,curl_off_t size)

{
  uint uVar1;
  
  if (size < 0) {
    (data->progress).ul.total_size = 0;
    uVar1 = (data->progress).flags & 0xffffffdf;
  }
  else {
    (data->progress).ul.total_size = size;
    uVar1 = (data->progress).flags | 0x20;
  }
  (data->progress).flags = uVar1;
  return;
}

Assistant:

void Curl_pgrsSetUploadSize(struct Curl_easy *data, curl_off_t size)
{
  if(size >= 0) {
    data->progress.ul.total_size = size;
    data->progress.flags |= PGRS_UL_SIZE_KNOWN;
  }
  else {
    data->progress.ul.total_size = 0;
    data->progress.flags &= ~PGRS_UL_SIZE_KNOWN;
  }
}